

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rt_rt.hpp
# Opt level: O1

type * viennamath::result_of::subtract<viennamath::ct_constant<8L>,_double,_true,_false>::instance
                 (type *__return_storage_ptr__,ct_constant<8L> *lhs,double *rhs)

{
  _func_int **pp_Var1;
  rt_expression_interface<double> *prVar2;
  op_interface<viennamath::rt_expression_interface<double>_> *poVar3;
  rt_expression_interface<double> *prVar4;
  
  prVar2 = (rt_expression_interface<double> *)operator_new(0x10);
  prVar2->_vptr_rt_expression_interface = (_func_int **)&PTR__rt_expression_interface_001303a0;
  prVar2[1]._vptr_rt_expression_interface = (_func_int **)0x4020000000000000;
  poVar3 = (op_interface<viennamath::rt_expression_interface<double>_> *)operator_new(8);
  poVar3->_vptr_op_interface = (_func_int **)&PTR__op_interface_00130640;
  pp_Var1 = (_func_int **)*rhs;
  prVar4 = (rt_expression_interface<double> *)operator_new(0x10);
  prVar4->_vptr_rt_expression_interface = (_func_int **)&PTR__rt_expression_interface_001303a0;
  prVar4[1]._vptr_rt_expression_interface = pp_Var1;
  (__return_storage_ptr__->super_rt_expression_interface<double>)._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_001300d0;
  (__return_storage_ptr__->lhs_)._M_ptr = prVar2;
  (__return_storage_ptr__->op_)._M_ptr = poVar3;
  (__return_storage_ptr__->rhs_)._M_ptr = prVar4;
  return __return_storage_ptr__;
}

Assistant:

static type instance(LHS const & lhs, RHS const & rhs) { return type(traits::clone<iface_type>(lhs), new op_binary<op_minus<numeric_type>, iface_type>(), traits::clone<iface_type>(rhs)); }